

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

Stmt * kratos::MultipleDriverVisitor::non_gen_root_parent(Stmt *stmt)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  InternalException *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  int iVar2;
  format_args args;
  undefined8 local_48 [2];
  string local_38;
  
  iVar2 = 0x2712;
  while( true ) {
    iVar1 = (*(stmt->super_IRNode)._vptr_IRNode[4])(stmt);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      return stmt;
    }
    iVar1 = (*(stmt->super_IRNode)._vptr_IRNode[4])(stmt);
    if (*(int *)(CONCAT44(extraout_var_00,iVar1) + 0x48) != 2) break;
    iVar1 = (*(stmt->super_IRNode)._vptr_IRNode[4])(stmt);
    stmt = (Stmt *)CONCAT44(extraout_var_01,iVar1);
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_48[0] = 0;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_48;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_38,(detail *)"Unable to find parent for statement",
                 (string_view)ZEXT816(0x23),args);
      InternalException::InternalException(this,&local_38);
      __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return stmt;
}

Assistant:

static Stmt* non_gen_root_parent(Stmt* stmt) {
        // this is just to get the root stmt parent that's holding given stmt
        IRNode* parent = stmt;
        uint32_t count = 0;
        while (parent->parent() && parent->parent()->ir_node_kind() == IRNodeKind::StmtKind) {
            parent = parent->parent();
            // this is to prevent infinite loop
            if (count++ > 10000) {
                throw InternalException(::format("Unable to find parent for statement"));
            }
        }
        return reinterpret_cast<Stmt*>(parent);
    }